

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void armci_msg_reduce_scope(int scope,void *x,int n,char *op,int type)

{
  ARMCI_Group group;
  
  if (scope == 0x151) {
    group = ARMCI_Node_group;
    if (_number_of_procs_per_node < 2) {
      group = -2;
    }
  }
  else {
    group = get_default_group();
  }
  do_gop(x,n,op,type,group);
  return;
}

Assistant:

void armci_msg_reduce_scope(int scope, void *x, int n, char *op, int type)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        do_gop(x, n, op, type, ARMCI_Node_group);
      } else {
        do_gop(x, n, op, type, ARMCI_GROUP_SELF);
      }
    } else {
        do_gop(x, n, op, type, get_default_group());
    }
}